

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tls.c
# Opt level: O0

void * task_func(void *args)

{
  int *piVar1;
  int *data;
  thread_local_t *tls;
  int i;
  void *args_local;
  
  piVar1 = (int *)tp_get_tls(args);
  for (tls._4_4_ = 0; tls._4_4_ < 3; tls._4_4_ = tls._4_4_ + 1) {
    *piVar1 = *piVar1 + 2 + *piVar1;
  }
  sleep(1);
  return (void *)0x0;
}

Assistant:

void *task_func(void *args)
{
    int i;
    thread_local_t *tls = args;

    int *data = tp_get_tls(tls);

    for (i = 0; i < 3; ++i) {
        *data += 2 + *data;
//        fprintf(stderr, "[%lu] %d\n", pthread_self(), *data);
    }

    sleep(1);

    return NULL;
}